

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall CConnman::GetFullOutboundConnCount(CConnman *this)

{
  pointer ppCVar1;
  int iVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock72;
  unique_lock<std::recursive_mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_20);
  iVar2 = 0;
  for (ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppCVar1 !=
      (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppCVar1 = ppCVar1 + 1) {
    if ((((*ppCVar1)->fSuccessfullyConnected)._M_base._M_i & 1U) != 0) {
      iVar2 = iVar2 + (uint)((*ppCVar1)->m_conn_type == OUTBOUND_FULL_RELAY);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CConnman::GetFullOutboundConnCount() const
{
    int nRelevant = 0;
    {
        LOCK(m_nodes_mutex);
        for (const CNode* pnode : m_nodes) {
            if (pnode->fSuccessfullyConnected && pnode->IsFullOutboundConn()) ++nRelevant;
        }
    }
    return nRelevant;
}